

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh_test.cc
# Opt level: O3

void __thiscall
ECDHTest_TestVectors_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,FileTest *t)

{
  internal iVar1;
  bool bVar2;
  int iVar3;
  EC_GROUP *group;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  pointer pcVar5;
  char *in_R9;
  pointer *__ptr;
  uint8_t digest [32];
  uint8_t expected_digest [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> actual_z;
  vector<unsigned_char,_std::allocator<unsigned_char>_> z;
  UniquePtr<EC_KEY> key;
  int ret;
  UniquePtr<EC_POINT> peer_pub_key;
  UniquePtr<EC_POINT> pub_key;
  UniquePtr<BIGNUM> peer_y;
  UniquePtr<BIGNUM> peer_x;
  UniquePtr<BIGNUM> y;
  UniquePtr<BIGNUM> x;
  UniquePtr<BIGNUM> priv_key;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  _Head_base<0UL,_ec_key_st_*,_false> local_90;
  int local_84;
  _Head_base<0UL,_ec_point_st_*,_false> local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  unique_ptr<ec_point_st,_bssl::internal::Deleter> local_68;
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [16];
  AssertHelper local_30;
  undefined8 local_28;
  
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_118._M_local_buf[0] = '\0';
  local_f8._M_allocated_capacity._0_4_ = 0x76727543;
  local_f8._M_allocated_capacity._4_2_ = 0x65;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
  local_128 = (undefined1  [8])&local_118;
  local_108 = (undefined1  [8])&local_f8;
  bVar2 = FileTest::GetAttribute((FileTest *)this,(string *)local_128,(string *)local_108);
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,
                    CONCAT26(local_f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_f8._M_allocated_capacity._4_2_,
                                      local_f8._M_allocated_capacity._0_4_)) + 1);
  }
  if (bVar2) {
    iVar3 = std::__cxx11::string::compare(local_128);
    if (iVar3 == 0) {
      group = EC_group_p224();
    }
    else {
      iVar3 = std::__cxx11::string::compare(local_128);
      if (iVar3 == 0) {
        group = EC_group_p256();
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_128);
        if (iVar3 == 0) {
          group = EC_group_p384();
        }
        else {
          iVar3 = std::__cxx11::string::compare(local_128);
          if (iVar3 == 0) {
            group = EC_group_p521();
          }
          else {
            group = (EC_GROUP *)0x0;
            FileTest::PrintLine((FileTest *)this,"Unknown curve \'%s\'",local_128);
          }
        }
      }
    }
  }
  else {
    group = (EC_GROUP *)0x0;
  }
  if (local_128 != (undefined1  [8])&local_118) {
    operator_delete((void *)local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  iVar1 = (internal)(group != (EC_GROUP *)0x0);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_108[0] = iVar1;
  if (group == (EC_GROUP *)0x0) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_108,(AssertionResult *)0x5a54c5,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
               ,0x49,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,
                      CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1)
      ;
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_e8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(size_type *)local_e8 + 8))();
    }
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
    return;
  }
  GetBIGNUM((FileTest *)&stack0xffffffffffffffd8,(char *)this);
  local_108[0] = (internal)((BIGNUM *)local_28 != (BIGNUM *)0x0);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIGNUM *)local_28 == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_108,(AssertionResult *)"priv_key","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
               ,0x4b,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,
                      CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1)
      ;
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_e8 + 8))();
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,local_100);
    }
    goto LAB_0026c6eb;
  }
  GetBIGNUM((FileTest *)local_48,(char *)this);
  local_108[0] = (internal)
                 ((__uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>
                  )local_48 !=
                 (__uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>)
                 0x0);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((__uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>)local_48 ==
      (__uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>)0x0) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_108,(AssertionResult *)0x5928cd,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
               ,0x4d,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,
                      CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1)
      ;
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_e8 + 8))();
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,local_100);
    }
  }
  else {
    GetBIGNUM((FileTest *)local_50,(char *)this);
    local_108[0] = (internal)
                   ((_Head_base<0UL,_FileTest::LineReader_*,_false>)local_50 !=
                   (_Head_base<0UL,_FileTest::LineReader_*,_false>)0x0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((_Head_base<0UL,_FileTest::LineReader_*,_false>)local_50 ==
        (_Head_base<0UL,_FileTest::LineReader_*,_false>)0x0) {
      testing::Message::Message((Message *)local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_128,(internal *)local_108,(AssertionResult *)0x5a5c54,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                 ,0x4f,(char *)local_128);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if (local_128 != (undefined1  [8])&local_118) {
        operator_delete((void *)local_128,
                        CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) +
                        1);
      }
      if (local_e8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_e8 + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
    }
    else {
      GetBIGNUM((FileTest *)local_58,(char *)this);
      local_108[0] = (internal)
                     ((_Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>
                       )local_58 != (LineReader *)0x0);
      local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((_Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>)
          local_58 == (LineReader *)0x0) {
        testing::Message::Message((Message *)local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_128,(internal *)local_108,(AssertionResult *)"peer_x","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                   ,0x51,(char *)local_128);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
        if (local_128 != (undefined1  [8])&local_118) {
          operator_delete((void *)local_128,
                          CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0])
                          + 1);
        }
        if (local_e8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_e8 + 8))();
        }
        if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_100,local_100);
        }
      }
      else {
        GetBIGNUM((FileTest *)local_60,(char *)this);
        local_108[0] = (internal)(local_60 != (undefined1  [8])0x0);
        local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_60 == (undefined1  [8])0x0) {
          testing::Message::Message((Message *)local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_128,(internal *)local_108,(AssertionResult *)"peer_y","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                     ,0x53,(char *)local_128);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (local_128 != (undefined1  [8])&local_118) {
            operator_delete((void *)local_128,
                            CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]
                                    ) + 1);
          }
          if (local_e8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_e8 + 8))();
          }
          if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_100,local_100);
          }
        }
        else {
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_128 = (undefined1  [8])&local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Z","");
          bVar2 = FileTest::GetBytes((FileTest *)this,&local_a8,(string *)local_128);
          local_108[0] = (internal)bVar2;
          local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_128 == (undefined1  [8])&local_118) {
            if (!bVar2) goto LAB_0026c184;
LAB_0026baa3:
            if (local_100 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_100,local_100);
            }
            local_90._M_head_impl = (ec_key_st *)EC_KEY_new();
            local_108[0] = (internal)(local_90._M_head_impl != (EC_KEY *)0x0);
            local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_90._M_head_impl == (EC_KEY *)0x0) {
              testing::Message::Message((Message *)local_e8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_128,(internal *)local_108,(AssertionResult *)0x5e57b2,
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                         ,0x58,(char *)local_128);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_c8,(Message *)local_e8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
              if (local_128 != (undefined1  [8])&local_118) {
                operator_delete((void *)local_128,
                                CONCAT71(local_118._M_allocated_capacity._1_7_,
                                         local_118._M_local_buf[0]) + 1);
              }
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_e8 !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(size_type *)local_e8 + 8))();
              }
              if (local_100 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_100,local_100);
              }
            }
            else {
              local_68._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
                   EC_POINT_new((EC_GROUP *)group);
              local_108[0] = (internal)
                             ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
                              local_68._M_t.
                              super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                             (_Head_base<0UL,_ec_point_st_*,_false>)0x0);
              local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
                  local_68._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
                  (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
                testing::Message::Message((Message *)local_e8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_128,(internal *)local_108,(AssertionResult *)0x52b63f,
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_c8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                           ,0x5a,(char *)local_128);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_c8,(Message *)local_e8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
                if (local_128 != (undefined1  [8])&local_118) {
                  operator_delete((void *)local_128,
                                  CONCAT71(local_118._M_allocated_capacity._1_7_,
                                           local_118._M_local_buf[0]) + 1);
                }
                if (local_e8 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_e8 + 8))();
                }
                if (local_100 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_100,local_100);
                }
              }
              else {
                local_80._M_head_impl = (ec_point_st *)EC_POINT_new((EC_GROUP *)group);
                local_108[0] = (internal)(local_80._M_head_impl != (EC_POINT *)0x0);
                local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if (local_80._M_head_impl == (EC_POINT *)0x0) {
                  testing::Message::Message((Message *)local_e8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_128,(internal *)local_108,
                             (AssertionResult *)"peer_pub_key","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_c8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                             ,0x5c,(char *)local_128);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_c8,(Message *)local_e8);
LAB_0026c631:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
                  if (local_128 != (undefined1  [8])&local_118) {
                    operator_delete((void *)local_128,
                                    CONCAT71(local_118._M_allocated_capacity._1_7_,
                                             local_118._M_local_buf[0]) + 1);
                  }
                  if (local_e8 != (undefined1  [8])0x0) {
                    (**(code **)(*(size_type *)local_e8 + 8))();
                  }
                  if (local_100 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_100,local_100);
                  }
                }
                else {
                  iVar3 = EC_KEY_set_group((EC_KEY *)local_90._M_head_impl,(EC_GROUP *)group);
                  local_108[0] = (internal)(iVar3 != 0);
                  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)local_e8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_128,(internal *)local_108,
                               (AssertionResult *)"EC_KEY_set_group(key.get(), group)","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                               ,0x5d,(char *)local_128);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_c8,(Message *)local_e8);
                    goto LAB_0026c631;
                  }
                  iVar3 = EC_KEY_set_private_key((EC_KEY *)local_90._M_head_impl,(BIGNUM *)local_28)
                  ;
                  local_108[0] = (internal)(iVar3 != 0);
                  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)local_e8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_128,(internal *)local_108,
                               (AssertionResult *)
                               "EC_KEY_set_private_key(key.get(), priv_key.get())","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                               ,0x5e,(char *)local_128);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_c8,(Message *)local_e8);
                    goto LAB_0026c631;
                  }
                  iVar3 = EC_POINT_set_affine_coordinates_GFp
                                    ((EC_GROUP *)group,
                                     (EC_POINT *)
                                     local_68._M_t.
                                     super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                     (BIGNUM *)local_48,(BIGNUM *)local_50,(BN_CTX *)0x0);
                  local_108[0] = (internal)(iVar3 != 0);
                  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)local_e8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_128,(internal *)local_108,
                               (AssertionResult *)
                               "EC_POINT_set_affine_coordinates_GFp(group, pub_key.get(), x.get(), y.get(), nullptr)"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                               ,0x60,(char *)local_128);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_c8,(Message *)local_e8);
                    goto LAB_0026c631;
                  }
                  iVar3 = EC_POINT_set_affine_coordinates_GFp
                                    ((EC_GROUP *)group,(EC_POINT *)local_80._M_head_impl,
                                     (BIGNUM *)local_58,(BIGNUM *)local_60,(BN_CTX *)0x0);
                  local_108[0] = (internal)(iVar3 != 0);
                  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)local_e8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_128,(internal *)local_108,
                               (AssertionResult *)
                               "EC_POINT_set_affine_coordinates_GFp( group, peer_pub_key.get(), peer_x.get(), peer_y.get(), nullptr)"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                               ,0x62,(char *)local_128);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_c8,(Message *)local_e8);
                    goto LAB_0026c631;
                  }
                  iVar3 = EC_KEY_set_public_key
                                    ((EC_KEY *)local_90._M_head_impl,
                                     (EC_POINT *)
                                     local_68._M_t.
                                     super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl);
                  local_108[0] = (internal)(iVar3 != 0);
                  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)local_e8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_128,(internal *)local_108,
                               (AssertionResult *)"EC_KEY_set_public_key(key.get(), pub_key.get())",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                               ,99,(char *)local_128);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_c8,(Message *)local_e8);
                    goto LAB_0026c631;
                  }
                  iVar3 = EC_KEY_check_key((EC_KEY *)local_90._M_head_impl);
                  local_108[0] = (internal)(iVar3 != 0);
                  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)local_e8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_128,(internal *)local_108,
                               (AssertionResult *)"EC_KEY_check_key(key.get())","false","true",in_R9
                              );
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                               ,100,(char *)local_128);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_c8,(Message *)local_e8);
                    goto LAB_0026c631;
                  }
                  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start = (pointer)0x0;
                  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_c8,
                             (size_type)
                             (local_a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (1 - (long)local_a8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start)));
                  local_84 = ECDH_compute_key(local_c8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_c8.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_c8.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                              (EC_POINT *)local_80._M_head_impl,
                                              (EC_KEY *)local_90._M_head_impl,(KDF *)0x0);
                  local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
                  testing::internal::CmpHelperGE<int,int>
                            ((internal *)local_128,"ret","0",&local_84,(int *)local_108);
                  if (local_128[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_108);
                    if (local_120 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = (local_120->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)local_e8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                               ,0x6c,pcVar5);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)local_e8,(Message *)local_108);
LAB_0026c903:
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
                    if (local_108 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_108 + 8))();
                    }
                    if (local_120 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_120;
                      __ptr_00 = local_120;
LAB_0026c92c:
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()(this_00,__ptr_00);
                    }
                  }
                  else {
                    if (local_120 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_120,local_120);
                    }
                    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 -(long)local_a8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    local_108 = (undefined1  [8])
                                local_a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                    local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (long)local_84;
                    local_e8 = (undefined1  [8])
                               local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                    testing::internal::CmpHelperEQ<Bytes,Bytes>
                              ((internal *)local_128,"Bytes(z)",
                               "Bytes(actual_z.data(), static_cast<size_t>(ret))",(Bytes *)local_108
                               ,(Bytes *)local_e8);
                    if (local_128[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_108);
                      if (local_120 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = (local_120->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_e8,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                 ,0x6d,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_e8,(Message *)local_108);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
                      if (local_108 != (undefined1  [8])0x0) {
                        (**(code **)(*(long *)local_108 + 8))();
                      }
                    }
                    if (local_120 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_120,local_120);
                    }
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_c8,
                               (size_type)
                               (local_a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               ~(ulong)local_a8.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
                    local_84 = ECDH_compute_key(local_c8.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)local_c8.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_c8.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                (EC_POINT *)local_80._M_head_impl,
                                                (EC_KEY *)local_90._M_head_impl,(KDF *)0x0);
                    local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
                    testing::internal::CmpHelperGE<int,int>
                              ((internal *)local_128,"ret","0",&local_84,(int *)local_108);
                    if (local_128[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_108);
                      if (local_120 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = (local_120->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_e8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                 ,0x73,pcVar5);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_e8,(Message *)local_108);
                      goto LAB_0026c903;
                    }
                    if (local_120 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_120,local_120);
                    }
                    local_108 = (undefined1  [8])
                                local_a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 ~(ulong)local_a8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
                    local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (long)local_84;
                    local_e8 = (undefined1  [8])
                               local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                    testing::internal::CmpHelperEQ<Bytes,Bytes>
                              ((internal *)local_128,"Bytes(z.data(), z.size() - 1)",
                               "Bytes(actual_z.data(), static_cast<size_t>(ret))",(Bytes *)local_108
                               ,(Bytes *)local_e8);
                    if (local_128[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_108);
                      if (local_120 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = (local_120->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_e8,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                 ,0x75,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_e8,(Message *)local_108);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
                      if (local_108 != (undefined1  [8])0x0) {
                        (**(code **)(*(long *)local_108 + 8))();
                      }
                    }
                    if (local_120 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_120,local_120);
                    }
                    iVar3 = ECDH_compute_key_fips
                                      (local_128,0x20,local_80._M_head_impl,local_90._M_head_impl);
                    local_78[0] = iVar3 != 0;
                    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                    if (iVar3 != 0) {
                      SHA256(local_a8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)local_a8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,local_108);
                      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&DAT_00000020;
                      local_40._8_8_ = &DAT_00000020;
                      local_78 = (undefined1  [8])local_128;
                      local_40._0_8_ = local_108;
                      testing::internal::CmpHelperEQ<Bytes,Bytes>
                                ((internal *)local_e8,"Bytes(digest)","Bytes(expected_digest)",
                                 (Bytes *)local_78,(Bytes *)local_40);
                      if (local_e8[0] == (internal)0x0) {
                        testing::Message::Message((Message *)local_78);
                        if (local_e0 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar5 = "";
                        }
                        else {
                          pcVar5 = (local_e0->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_40,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                   ,0x7c,pcVar5);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_40,(Message *)local_78);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_40);
                        if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             )local_78 !=
                            (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             )0x0) {
                          (**(code **)(*(long *)local_78 + 8))();
                        }
                      }
                      if (local_e0 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      goto LAB_0026c931;
                      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_e0;
                      __ptr_00 = local_e0;
                      goto LAB_0026c92c;
                    }
                    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_70;
                    testing::Message::Message((Message *)local_40);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_e8,(internal *)local_78,
                               (AssertionResult *)
                               "ECDH_compute_key_fips(digest, sizeof(digest), peer_pub_key.get(), key.get())"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_30,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                               ,0x7a,(char *)local_e8);
                    testing::internal::AssertHelper::operator=(&local_30,(Message *)local_40);
                    testing::internal::AssertHelper::~AssertHelper(&local_30);
                    if (local_e8 != (undefined1  [8])&local_d8) {
                      operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
                    }
                    if ((long *)local_40._0_8_ != (long *)0x0) {
                      (**(code **)(*(long *)local_40._0_8_ + 8))();
                    }
                    __ptr_00 = local_70;
                    if (local_70 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                    goto LAB_0026c92c;
                  }
LAB_0026c931:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    operator_delete(local_c8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_c8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_c8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_80);
              }
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&local_68);
            }
            std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_90);
          }
          else {
            operator_delete((void *)local_128,
                            CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]
                                    ) + 1);
            if (((ulong)local_108 & 1) != 0) goto LAB_0026baa3;
LAB_0026c184:
            testing::Message::Message((Message *)local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_128,(internal *)local_108,
                       (AssertionResult *)"t->GetBytes(&z, \"Z\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                       ,0x55,(char *)local_128);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_c8,(Message *)local_e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
            if (local_128 != (undefined1  [8])&local_118) {
              operator_delete((void *)local_128,
                              CONCAT71(local_118._M_allocated_capacity._1_7_,
                                       local_118._M_local_buf[0]) + 1);
            }
            if (local_e8 != (undefined1  [8])0x0) {
              (**(code **)(*(size_type *)local_e8 + 8))();
            }
            if (local_100 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_100,local_100);
            }
          }
          if ((long *)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
            operator_delete(local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_60);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_58);
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_50);
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_48);
LAB_0026c6eb:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

TEST(ECDHTest, TestVectors) {
  FileTestGTest("crypto/ecdh/ecdh_tests.txt", [](FileTest *t) {
    const EC_GROUP *group = GetCurve(t, "Curve");
    ASSERT_TRUE(group);
    bssl::UniquePtr<BIGNUM> priv_key = GetBIGNUM(t, "Private");
    ASSERT_TRUE(priv_key);
    bssl::UniquePtr<BIGNUM> x = GetBIGNUM(t, "X");
    ASSERT_TRUE(x);
    bssl::UniquePtr<BIGNUM> y = GetBIGNUM(t, "Y");
    ASSERT_TRUE(y);
    bssl::UniquePtr<BIGNUM> peer_x = GetBIGNUM(t, "PeerX");
    ASSERT_TRUE(peer_x);
    bssl::UniquePtr<BIGNUM> peer_y = GetBIGNUM(t, "PeerY");
    ASSERT_TRUE(peer_y);
    std::vector<uint8_t> z;
    ASSERT_TRUE(t->GetBytes(&z, "Z"));

    bssl::UniquePtr<EC_KEY> key(EC_KEY_new());
    ASSERT_TRUE(key);
    bssl::UniquePtr<EC_POINT> pub_key(EC_POINT_new(group));
    ASSERT_TRUE(pub_key);
    bssl::UniquePtr<EC_POINT> peer_pub_key(EC_POINT_new(group));
    ASSERT_TRUE(peer_pub_key);
    ASSERT_TRUE(EC_KEY_set_group(key.get(), group));
    ASSERT_TRUE(EC_KEY_set_private_key(key.get(), priv_key.get()));
    ASSERT_TRUE(EC_POINT_set_affine_coordinates_GFp(group, pub_key.get(),
                                                    x.get(), y.get(), nullptr));
    ASSERT_TRUE(EC_POINT_set_affine_coordinates_GFp(
        group, peer_pub_key.get(), peer_x.get(), peer_y.get(), nullptr));
    ASSERT_TRUE(EC_KEY_set_public_key(key.get(), pub_key.get()));
    ASSERT_TRUE(EC_KEY_check_key(key.get()));

    std::vector<uint8_t> actual_z;
    // Make |actual_z| larger than expected to ensure |ECDH_compute_key| returns
    // the right amount of data.
    actual_z.resize(z.size() + 1);
    int ret = ECDH_compute_key(actual_z.data(), actual_z.size(),
                               peer_pub_key.get(), key.get(), nullptr);
    ASSERT_GE(ret, 0);
    EXPECT_EQ(Bytes(z), Bytes(actual_z.data(), static_cast<size_t>(ret)));

    // Test |ECDH_compute_key| truncates.
    actual_z.resize(z.size() - 1);
    ret = ECDH_compute_key(actual_z.data(), actual_z.size(), peer_pub_key.get(),
                           key.get(), nullptr);
    ASSERT_GE(ret, 0);
    EXPECT_EQ(Bytes(z.data(), z.size() - 1),
              Bytes(actual_z.data(), static_cast<size_t>(ret)));

    // Test that |ECDH_compute_key_fips| hashes as expected.
    uint8_t digest[SHA256_DIGEST_LENGTH], expected_digest[SHA256_DIGEST_LENGTH];
    ASSERT_TRUE(ECDH_compute_key_fips(digest, sizeof(digest),
                                      peer_pub_key.get(), key.get()));
    SHA256(z.data(), z.size(), expected_digest);
    EXPECT_EQ(Bytes(digest), Bytes(expected_digest));
  });
}